

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

bool __thiscall stick::Error::operator==(Error *this,Error *_other)

{
  undefined8 uVar1;
  long local_f0;
  Error a;
  Error b;
  
  (*this->m_category->_vptr_ErrorCategory[2])(&local_f0,this->m_category,this);
  (*_other->m_category->_vptr_ErrorCategory[2])(&a.m_line,_other->m_category,_other);
  uVar1 = a._80_8_;
  if (b.m_message.m_allocator != (Allocator *)0x0) {
    (**(code **)(*(long *)b.m_file.m_capacity + 0x18))();
  }
  if (b._8_8_ != 0) {
    (**(code **)(*(long *)b.m_message.m_capacity + 0x18))();
  }
  if (a.m_message.m_allocator != (Allocator *)0x0) {
    a._80_8_ = a.m_message.m_allocator;
    (**(code **)(*(long *)a.m_file.m_capacity + 0x18))();
    a.m_message.m_allocator = (Allocator *)0x0;
    a.m_file.m_cStr = (char *)0x0;
    a.m_file.m_length = 0;
  }
  if (a._8_8_ != 0) {
    a.m_line = a.m_code;
    a._84_4_ = a._12_4_;
    (**(code **)(*(long *)a.m_message.m_capacity + 0x18))();
  }
  return local_f0 == uVar1 && (int)a.m_category == (int)b.m_category;
}

Assistant:

bool Error::operator==(const Error & _other) const
{
    Error a = resolvedCode();
    Error b = _other.resolvedCode();
    return a.m_code == b.m_code && a.m_category == b.m_category;
}